

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

int build_cur_mv(int_mv *cur_mv,PREDICTION_MODE this_mode,AV1_COMMON *cm,MACROBLOCK *x,
                int skip_repeated_ref_mv)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  MB_MODE_INFO *pMVar5;
  bool bVar6;
  undefined1 *puVar7;
  short sVar8;
  int iVar9;
  uint uVar10;
  int_mv *piVar11;
  char cVar12;
  byte bVar13;
  uint uVar14;
  int_mv *piVar15;
  int iVar16;
  undefined7 in_register_00000031;
  long lVar17;
  short sVar18;
  int iVar19;
  ulong uVar20;
  char cVar21;
  int_mv iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  
  pMVar5 = *(x->e_mbd).mi;
  cVar1 = pMVar5->ref_frame[1];
  lVar26 = 0;
LAB_00216884:
  uVar25 = *(ushort *)&pMVar5->field_0xa7 >> 4 & 3;
  puVar7 = compound_ref1_mode_lut;
  if (lVar26 == 0) {
    puVar7 = compound_ref0_mode_lut;
  }
  cVar2 = puVar7[CONCAT71(in_register_00000031,this_mode) & 0xffffffff];
  iVar22.as_int = 0x80008000;
  if (cVar2 != '\x10') {
    if (cVar2 == '\x0f') {
      if (skip_repeated_ref_mv == 0) {
LAB_00216acf:
        piVar11 = (x->mbmi_ext).global_mvs + pMVar5->ref_frame[lVar26];
        goto LAB_00216b94;
      }
      bVar13 = pMVar5->ref_frame[0];
      cVar21 = pMVar5->ref_frame[1];
      if ('\0' < cVar21) {
        cVar12 = -1;
        if (cVar21 < '\x05' || '\x04' < (char)bVar13) {
          lVar17 = 0;
          do {
            if ((bVar13 == (&comp_ref0_lut)[lVar17]) && (cVar21 == (&comp_ref1_lut)[lVar17])) {
              cVar12 = (char)lVar17;
              break;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != 9);
        }
        if (cVar12 < '\0') {
          bVar13 = (cVar21 * '\x04' + bVar13) - 0xd;
        }
        else {
          bVar13 = cVar12 + 0x14;
        }
      }
      bVar3 = (x->mbmi_ext).ref_mv_count[bVar13];
      bVar6 = true;
      uVar14 = (uint)bVar3;
      if (bVar3 != 0) {
        if (uVar14 != 1) {
          uVar14 = (uint)bVar3;
          if (3 < bVar3) {
            uVar14 = 4;
          }
          uVar20 = (ulong)uVar14;
          piVar11 = &(x->mbmi_ext).ref_mv_stack[bVar13][0].comp_mv;
          do {
            piVar15 = piVar11 + 0xffffffffffffffff;
            if (lVar26 != 0) {
              piVar15 = piVar11;
            }
            if (piVar15->as_int == (x->mbmi_ext).global_mvs[pMVar5->ref_frame[lVar26]].as_int)
            goto LAB_00216e0f;
            piVar11 = piVar11 + 2;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        goto LAB_00216acf;
      }
      goto LAB_00216b99;
    }
    bVar13 = pMVar5->ref_frame[0];
    cVar21 = pMVar5->ref_frame[1];
    if ('\0' < cVar21) {
      cVar12 = -1;
      if (cVar21 < '\x05' || '\x04' < (char)bVar13) {
        lVar17 = 0;
        do {
          if ((bVar13 == (&comp_ref0_lut)[lVar17]) && (cVar21 == (&comp_ref1_lut)[lVar17])) {
            cVar12 = (char)lVar17;
            break;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
      }
      if (cVar12 < '\0') {
        bVar13 = (cVar21 * '\x04' + bVar13) - 0xd;
      }
      else {
        bVar13 = cVar12 + 0x14;
      }
    }
    uVar14 = uVar25 + 1;
    if (cVar2 == '\r') {
      uVar14 = 0;
    }
    if (uVar14 < (x->mbmi_ext).ref_mv_count[bVar13]) {
      if (lVar26 == 0) {
        piVar11 = &(x->mbmi_ext).ref_mv_stack[bVar13][uVar14].this_mv;
      }
      else {
        piVar11 = &(x->mbmi_ext).ref_mv_stack[bVar13][uVar14].comp_mv;
      }
LAB_00216b94:
      iVar22 = *piVar11;
      goto LAB_00216b97;
    }
    if (skip_repeated_ref_mv == 0) {
LAB_00216b7e:
      piVar11 = (x->mbmi_ext).global_mvs + pMVar5->ref_frame[lVar26];
      goto LAB_00216b94;
    }
    bVar13 = pMVar5->ref_frame[0];
    if ('\0' < cVar21) {
      cVar12 = -1;
      if (cVar21 < '\x05' || '\x04' < (char)bVar13) {
        lVar17 = 0;
        do {
          if ((bVar13 == (&comp_ref0_lut)[lVar17]) && (cVar21 == (&comp_ref1_lut)[lVar17])) {
            cVar12 = (char)lVar17;
            break;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
      }
      if (cVar12 < '\0') {
        bVar13 = (cVar21 * '\x04' + bVar13) - 0xd;
      }
      else {
        bVar13 = cVar12 + 0x14;
      }
    }
    bVar3 = (x->mbmi_ext).ref_mv_count[bVar13];
    if (cVar2 == '\x0f') {
      uVar14 = (uint)bVar3;
      if (bVar3 != 0) {
        if (uVar14 != 1) {
          uVar14 = (uint)bVar3;
          if (3 < bVar3) {
            uVar14 = 4;
          }
          uVar20 = (ulong)uVar14;
          piVar11 = &(x->mbmi_ext).ref_mv_stack[bVar13][0].comp_mv;
          do {
            piVar15 = piVar11 + 0xffffffffffffffff;
            if (lVar26 != 0) {
              piVar15 = piVar11;
            }
            if (piVar15->as_int == (x->mbmi_ext).global_mvs[pMVar5->ref_frame[lVar26]].as_int)
            goto LAB_00216e0f;
            piVar11 = piVar11 + 2;
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
        goto LAB_00216b7e;
      }
    }
    else {
      if ((cVar2 != '\x0e') || (1 < bVar3)) goto LAB_00216b7e;
      uVar14 = 0;
    }
    goto LAB_00216e17;
  }
LAB_00216b97:
  bVar6 = false;
  uVar14 = 1;
  goto LAB_00216b99;
LAB_00216e0f:
  uVar14 = 0;
LAB_00216e17:
  bVar6 = true;
LAB_00216b99:
  uVar10 = 0;
  if (!bVar6) {
    if (cVar2 == '\x10') {
      bVar13 = pMVar5->ref_frame[0];
      cVar2 = pMVar5->ref_frame[1];
      if ('\0' < cVar2) {
        cVar21 = -1;
        if (cVar2 < '\x05' || '\x04' < (char)bVar13) {
          lVar17 = 0;
          do {
            if ((bVar13 == (&comp_ref0_lut)[lVar17]) && (cVar2 == (&comp_ref1_lut)[lVar17])) {
              cVar21 = (char)lVar17;
              break;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != 9);
        }
        if (cVar21 < '\0') {
          bVar13 = (cVar2 * '\x04' + bVar13) - 0xd;
        }
        else {
          bVar13 = cVar21 + 0x14;
        }
      }
      piVar11 = &(x->mbmi_ext).ref_mv_stack[bVar13][uVar25].comp_mv;
      if (lVar26 == 0) {
        piVar11 = &(x->mbmi_ext).ref_mv_stack[bVar13][uVar25].this_mv;
      }
      cur_mv[lVar26] = *piVar11;
      uVar10 = uVar14;
    }
    else {
      cur_mv[lVar26].as_int = (uint32_t)iVar22;
      if ((cm->features).cur_frame_force_integer_mv == false) {
        if ((cm->features).allow_high_precision_mv == false) {
          uVar4 = cur_mv[lVar26].as_mv.row;
          if ((uVar4 & 1) != 0) {
            cur_mv[lVar26].as_mv.row = uVar4 + (ushort)((short)uVar4 < 1) * 2 + -1;
          }
          uVar4 = *(ushort *)((long)cur_mv + lVar26 * 4 + 2);
          if ((uVar4 & 1) != 0) {
            *(ushort *)((long)cur_mv + lVar26 * 4 + 2) = uVar4 + (ushort)((short)uVar4 < 1) * 2 + -1
            ;
          }
        }
      }
      else {
        uVar25 = (int)cur_mv[lVar26].as_mv.row % 8;
        if (uVar25 != 0) {
          sVar8 = cur_mv[lVar26].as_mv.row - (short)uVar25;
          cur_mv[lVar26].as_mv.row = sVar8;
          uVar10 = -uVar25;
          if (0 < (int)uVar25) {
            uVar10 = uVar25;
          }
          if (4 < uVar10) {
            cur_mv[lVar26].as_mv.row = sVar8 + (ushort)(0 < (int)uVar25) * 0x10 + -8;
          }
        }
        sVar8 = *(short *)((long)cur_mv + lVar26 * 4 + 2);
        uVar25 = (int)sVar8 % 8;
        if (uVar25 != 0) {
          sVar8 = sVar8 - (short)uVar25;
          *(short *)((long)cur_mv + lVar26 * 4 + 2) = sVar8;
          uVar10 = -uVar25;
          if (0 < (int)uVar25) {
            uVar10 = uVar25;
          }
          if (4 < uVar10) {
            if ((int)uVar25 < 1) {
              sVar8 = sVar8 + -8;
            }
            else {
              sVar8 = sVar8 + 8;
            }
            *(short *)((long)cur_mv + lVar26 * 4 + 2) = sVar8;
          }
        }
      }
      iVar9 = (x->e_mbd).mb_to_left_edge + -0x8e0;
      iVar24 = (x->e_mbd).mb_to_right_edge + 0x8e0;
      iVar16 = (x->e_mbd).mb_to_top_edge + -0x8e0;
      iVar19 = (x->e_mbd).mb_to_bottom_edge + 0x8e0;
      iVar23 = (int)*(short *)((long)cur_mv + lVar26 * 4 + 2);
      if (iVar23 < iVar24) {
        iVar24 = iVar23;
      }
      if (iVar23 < iVar9) {
        iVar24 = iVar9;
      }
      sVar8 = (short)iVar24;
      *(short *)((long)cur_mv + lVar26 * 4 + 2) = sVar8;
      iVar24 = (int)cur_mv[lVar26].as_mv.row;
      if (iVar24 < iVar19) {
        iVar19 = iVar24;
      }
      sVar18 = (short)iVar19;
      if (iVar24 < iVar16) {
        sVar18 = (short)iVar16;
      }
      cur_mv[lVar26].as_mv.row = sVar18;
      iVar24 = (int)((uint)(-1 < sVar8) + (int)sVar8 + 3) >> 3;
      uVar10 = 0;
      if ((((x->mv_limits).col_min <= iVar24) && (iVar24 <= (x->mv_limits).col_max)) &&
         (iVar24 = (int)((uint)(-1 < sVar18) + (int)sVar18 + 3) >> 3, uVar10 = 0,
         (x->mv_limits).row_min <= iVar24)) {
        uVar10 = (uint)(iVar24 <= (x->mv_limits).row_max);
      }
      uVar10 = uVar10 & uVar14;
    }
  }
  if (bVar6) {
    return 0;
  }
  if (lVar26 != 0) {
    return uVar10;
  }
  lVar26 = 1;
  if (cVar1 < '\x01') {
    return uVar10;
  }
  goto LAB_00216884;
}

Assistant:

static inline int build_cur_mv(int_mv *cur_mv, PREDICTION_MODE this_mode,
                               const AV1_COMMON *cm, const MACROBLOCK *x,
                               int skip_repeated_ref_mv) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_comp_pred = has_second_ref(mbmi);

  int ret = 1;
  for (int i = 0; i < is_comp_pred + 1; ++i) {
    int_mv this_mv;
    this_mv.as_int = INVALID_MV;
    ret = get_this_mv(&this_mv, this_mode, i, mbmi->ref_mv_idx,
                      skip_repeated_ref_mv, mbmi->ref_frame, &x->mbmi_ext);
    if (!ret) return 0;
    const PREDICTION_MODE single_mode = get_single_mode(this_mode, i);
    if (single_mode == NEWMV) {
      const uint8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
      cur_mv[i] =
          (i == 0) ? x->mbmi_ext.ref_mv_stack[ref_frame_type][mbmi->ref_mv_idx]
                         .this_mv
                   : x->mbmi_ext.ref_mv_stack[ref_frame_type][mbmi->ref_mv_idx]
                         .comp_mv;
    } else {
      ret &= clamp_and_check_mv(cur_mv + i, this_mv, cm, x);
    }
  }
  return ret;
}